

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O2

int * Gia_ManFraigSelectReprs(Gia_Man_t *p,Gia_Man_t *pClp,int fVerbose,int *pFlopTypes)

{
  void *pvVar1;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int *__s;
  undefined4 *__s_00;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  int *piVar8;
  uint uVar9;
  int iVar10;
  size_t __size;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint local_48;
  uint local_44;
  
  __size = (long)p->nObjs << 2;
  pvVar1 = p->pManTime;
  __s = (int *)malloc(__size);
  memset(__s,0xff,__size);
  uVar11 = (ulong)pClp->nObjs;
  __s_00 = (undefined4 *)malloc(uVar11 * 4);
  memset(__s_00,0xff,uVar11 * 4);
  if (pvVar1 == (void *)0x0) {
    __assert_fail("pManTime != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x1d0,"int *Gia_ManFraigSelectReprs(Gia_Man_t *, Gia_Man_t *, int, int *)");
  }
  uVar13 = 0;
  uVar15 = 1;
  uVar9 = 0;
  while (((long)uVar15 < (long)(int)uVar11 &&
         (pGVar7 = Gia_ManObj(pClp,(int)uVar15), pGVar7 != (Gia_Obj_t *)0x0))) {
    if ((-1 < (int)*(uint *)pGVar7 || (~*(uint *)pGVar7 & 0x1fffffff) == 0) &&
       (uVar11 = (ulong)(uint)pClp->pReprs[uVar15] & 0xfffffff,
       uVar15 != uVar11 && uVar11 != 0xfffffff)) {
      if ((int)uVar11 == 0) {
        uVar13 = uVar13 + 1;
      }
      else {
        uVar9 = uVar9 + 1;
      }
    }
    uVar15 = uVar15 + 1;
    uVar11 = (ulong)(uint)pClp->nObjs;
  }
  if (fVerbose != 0) {
    printf("Computed %d const objects and %d other objects.\n",(ulong)uVar13,(ulong)uVar9);
  }
  Gia_ManCleanMark0(p);
  iVar10 = p->vCos->nSize;
  iVar6 = p->nRegs;
  iVar3 = Gia_ManRegBoxNum(p);
  for (iVar10 = iVar10 - (iVar3 + iVar6); iVar10 < p->vCos->nSize - p->nRegs; iVar10 = iVar10 + 1) {
    pGVar7 = Gia_ManPo(p,iVar10);
    uVar11 = (ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff);
    if (((uint)*(ulong *)(pGVar7 + -uVar11) & 0x9fffffff) != 0x9fffffff) {
      __assert_fail("Gia_ObjIsCi(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                    ,0x1e6,"int *Gia_ManFraigSelectReprs(Gia_Man_t *, Gia_Man_t *, int, int *)");
    }
    *(ulong *)(pGVar7 + -uVar11) = *(ulong *)(pGVar7 + -uVar11) | 0x40000000;
  }
  p_00 = Gia_ManComputeCarryOuts(p);
  uVar13 = p_00->nSize;
  uVar9 = 0;
  uVar14 = 0;
  if (0 < (int)uVar13) {
    uVar9 = uVar13;
    uVar14 = 0;
  }
  for (; uVar9 != uVar14; uVar14 = uVar14 + 1) {
    iVar10 = Vec_IntEntry(p_00,uVar14);
    pGVar7 = Gia_ManObj(p,iVar10);
    if (pGVar7 == (Gia_Obj_t *)0x0) break;
    pGVar7->field_0x3 = pGVar7->field_0x3 | 0x40;
  }
  if (fVerbose != 0) {
    uVar9 = Gia_ManRegBoxNum(p);
    uVar14 = Gia_ManNonRegBoxNum(p);
    printf("Fixed %d flop inputs and %d box/box connections (out of %d non-flop boxes).\n",
           (ulong)uVar9,(ulong)uVar13,(ulong)uVar14);
  }
  Vec_IntFree(p_00);
  pFlopTypes[2] = 0;
  pFlopTypes[0] = 0;
  pFlopTypes[1] = 0;
  lVar12 = 0;
  while ((lVar12 < pClp->nRegs &&
         (pGVar7 = Gia_ManCi(pClp,(pClp->vCis->nSize - pClp->nRegs) + (int)lVar12),
         pGVar7 != (Gia_Obj_t *)0x0))) {
    uVar13 = (uint)pClp->pReprs[lVar12] & 0xfffffff;
    if (((uVar13 != 0xfffffff) &&
        ((pObj = Gia_ManObj(pClp,uVar13), pObj != (Gia_Obj_t *)0x0 && (pObj != pGVar7)))) &&
       ((piVar8 = pFlopTypes, pObj == pClp->pObjs ||
        ((((undefined1  [12])*pObj & (undefined1  [12])0x9fffffff) == (undefined1  [12])0x9fffffff
         && (iVar10 = Gia_ObjCioId(pObj), piVar8 = pFlopTypes + 1,
            pClp->vCis->nSize - pClp->nRegs <= iVar10)))))) {
      *piVar8 = *piVar8 + 1;
    }
    lVar12 = lVar12 + 1;
  }
  *__s_00 = 0;
  Gia_ManSetPhase(pClp);
  local_48 = 0;
  local_44 = 0;
  for (uVar11 = 1; (long)uVar11 < (long)p->nObjs; uVar11 = uVar11 + 1) {
    pGVar7 = Gia_ManObj(p,(int)uVar11);
    if (pGVar7 == (Gia_Obj_t *)0x0) break;
    uVar13 = (uint)*(ulong *)pGVar7;
    uVar15 = *(ulong *)pGVar7 & 0x1fffffff;
    if (-1 < (int)uVar13 || uVar15 == 0x1fffffff) {
      if ((uVar13 & 0x9fffffff) == 0x9fffffff) {
        if ((uVar13 >> 0x1e & 1) != 0) goto LAB_002089a2;
      }
      else if (((int)uVar13 < 0) || ((int)uVar15 == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                      ,0x209,"int *Gia_ManFraigSelectReprs(Gia_Man_t *, Gia_Man_t *, int, int *)");
      }
      uVar13 = pGVar7->Value;
      if (uVar13 != 0xffffffff) {
        uVar14 = Abc_Lit2Var(uVar13);
        uVar9 = (uint)pClp->pReprs[uVar14] & 0xfffffff;
        if (uVar9 == 0xfffffff) {
          uVar9 = uVar14;
        }
        iVar10 = __s_00[uVar9];
        if (iVar10 == -1) {
          __s_00[uVar9] = (int)uVar11;
        }
        else {
          pGVar7 = Gia_ManObj(p,iVar10);
          uVar9 = pGVar7->Value;
          uVar4 = Abc_Lit2Var(uVar13);
          uVar14 = (uint)pClp->pReprs[uVar4] & 0xfffffff;
          if (uVar14 == 0xfffffff) {
            uVar14 = uVar4;
          }
          uVar5 = Abc_Lit2Var(uVar9);
          uVar4 = (uint)pClp->pReprs[uVar5] & 0xfffffff;
          if (uVar4 == 0xfffffff) {
            uVar4 = uVar5;
          }
          if (uVar14 != uVar4) {
            __assert_fail("Gia_ObjReprSelf(pClp, Abc_Lit2Var(iLitClp)) == Gia_ObjReprSelf(pClp, Abc_Lit2Var(iLitClp2))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                          ,0x213,
                          "int *Gia_ManFraigSelectReprs(Gia_Man_t *, Gia_Man_t *, int, int *)");
          }
          uVar14 = Abc_LitIsCompl(uVar13);
          uVar4 = Abc_LitIsCompl(uVar9);
          iVar6 = Abc_Lit2Var(uVar13);
          pGVar7 = Gia_ManObj(pClp,iVar6);
          uVar2 = *(undefined8 *)pGVar7;
          iVar6 = Abc_Lit2Var(uVar9);
          pGVar7 = Gia_ManObj(pClp,iVar6);
          iVar6 = Abc_Var2Lit(iVar10,(uint)((ulong)*(undefined8 *)pGVar7 >> 0x3f) ^
                                     (uint)((ulong)uVar2 >> 0x3f) ^ uVar14 ^ uVar4);
          __s[uVar11] = iVar6;
          uVar13 = Abc_Lit2Var(iVar6);
          if (uVar11 <= uVar13) {
            __assert_fail("Abc_Lit2Var(pReprs[i]) < i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                          ,0x218,
                          "int *Gia_ManFraigSelectReprs(Gia_Man_t *, Gia_Man_t *, int, int *)");
          }
          if (iVar10 == 0) {
            local_48 = local_48 + 1;
          }
          else {
            local_44 = local_44 + 1;
          }
        }
      }
    }
LAB_002089a2:
  }
  free(__s_00);
  iVar10 = 0;
  while ((iVar10 < p->vCis->nSize && (pGVar7 = Gia_ManCi(p,iVar10), pGVar7 != (Gia_Obj_t *)0x0))) {
    pGVar7->field_0x3 = pGVar7->field_0x3 & 0xbf;
    iVar10 = iVar10 + 1;
  }
  if (fVerbose != 0) {
    printf("Found %d const objects and %d other objects.\n",(ulong)local_48,(ulong)local_44);
  }
  return __s;
}

Assistant:

int * Gia_ManFraigSelectReprs( Gia_Man_t * p, Gia_Man_t * pClp, int fVerbose, int pFlopTypes[3] )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vCarryOuts;
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    int * pReprs   = ABC_FALLOC( int, Gia_ManObjNum(p) );
    int * pClp2Gia = ABC_FALLOC( int, Gia_ManObjNum(pClp) );
    int i, iLitClp, iLitClp2, iReprClp, fCompl;
    int nConsts = 0, nReprs = 0;
    assert( pManTime != NULL );
    // count the number of equivalent objects
    Gia_ManForEachObj1( pClp, pObj, i )
    {
        if ( Gia_ObjIsCo(pObj) )
            continue;
        if ( i == Gia_ObjReprSelf(pClp, i) )
            continue;
        if ( Gia_ObjReprSelf(pClp, i) == 0 )
            nConsts++;
        else
            nReprs++;
    }
    if ( fVerbose )
        printf( "Computed %d const objects and %d other objects.\n", nConsts, nReprs );
    nConsts = nReprs = 0;

    // mark flop input boxes
    Gia_ManCleanMark0( p );
    for ( i = Gia_ManPoNum(p) - Gia_ManRegBoxNum(p); i < Gia_ManPoNum(p); i++ )
    {
        pObj = Gia_ObjFanin0( Gia_ManPo(p, i) );
        assert( Gia_ObjIsCi(pObj) );
        pObj->fMark0 = 1;
    }
    // mark connects between last box inputs and first box outputs
    vCarryOuts = Gia_ManComputeCarryOuts( p );
    Gia_ManForEachObjVec( vCarryOuts, p, pObj, i )
        pObj->fMark0 = 1;
    if ( fVerbose )
        printf( "Fixed %d flop inputs and %d box/box connections (out of %d non-flop boxes).\n", 
            Gia_ManRegBoxNum(p), Vec_IntSize(vCarryOuts), Gia_ManNonRegBoxNum(p) );
    Vec_IntFree( vCarryOuts );

    // collect equivalent node info
    pFlopTypes[0] = pFlopTypes[1] = pFlopTypes[2] = 0;
    Gia_ManForEachRo( pClp, pObj, i )
    {
        Gia_Obj_t * pRepr = Gia_ObjReprObj(pClp, i);
        if ( pRepr && pRepr != pObj )
        {
            if ( pRepr == Gia_ManConst0(pClp) )
                pFlopTypes[0]++;
            else if ( Gia_ObjIsRo(pClp, pRepr) )
                pFlopTypes[1]++;
        }
    }

    // compute representatives
    pClp2Gia[0] = 0;
    Gia_ManSetPhase( pClp );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCo(pObj) )
            continue;
        if ( Gia_ObjIsCi(pObj) && pObj->fMark0 ) // skip CI pointed by CO
            continue;
        assert( Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj) );
        iLitClp = Gia_ObjValue(pObj);
        if ( iLitClp == -1 )
            continue;
        iReprClp = Gia_ObjReprSelf( pClp, Abc_Lit2Var(iLitClp) );
        if ( pClp2Gia[iReprClp] == -1 )
            pClp2Gia[iReprClp] = i;
        else
        { 
            iLitClp2 = Gia_ObjValue( Gia_ManObj(p, pClp2Gia[iReprClp]) );
            assert( Gia_ObjReprSelf(pClp, Abc_Lit2Var(iLitClp)) == Gia_ObjReprSelf(pClp, Abc_Lit2Var(iLitClp2)) );
            fCompl  = Abc_LitIsCompl(iLitClp) ^ Abc_LitIsCompl(iLitClp2);
            fCompl ^= Gia_ManObj(pClp, Abc_Lit2Var(iLitClp))->fPhase;
            fCompl ^= Gia_ManObj(pClp, Abc_Lit2Var(iLitClp2))->fPhase;
            pReprs[i] = Abc_Var2Lit( pClp2Gia[iReprClp], fCompl );
            assert( Abc_Lit2Var(pReprs[i]) < i );
            if ( pClp2Gia[iReprClp] == 0 )
                nConsts++;
            else
                nReprs++;
        }
    }
    ABC_FREE( pClp2Gia );
    Gia_ManForEachCi( p, pObj, i )
        pObj->fMark0 = 0;
    if ( fVerbose )
        printf( "Found %d const objects and %d other objects.\n", nConsts, nReprs );
    return pReprs;
}